

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O2

int npf_parse_format_spec(char *format,npf_format_spec_t *out_spec)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  char cVar7;
  char cVar8;
  char *cur;
  uint8_t uVar9;
  
  out_spec->left_justified = '\0';
  out_spec->leading_zero_pad = '\0';
  out_spec->case_adjust = ' ';
  out_spec->prepend = '\0';
  out_spec->alt_form = '\0';
  cVar7 = '\x01';
  pcVar4 = format;
  cVar8 = '\0';
LAB_0010acb3:
  while( true ) {
    while( true ) {
      while( true ) {
        pcVar3 = pcVar4 + 1;
        cVar1 = *pcVar3;
        if (cVar1 == ' ') goto LAB_0010acd1;
        if (cVar1 != '#') break;
        out_spec->alt_form = '#';
        pcVar4 = pcVar3;
      }
      if (cVar1 != '0') break;
      out_spec->leading_zero_pad = cVar7;
      pcVar4 = pcVar3;
    }
    if (cVar1 == '+') goto LAB_0010acf3;
    if (cVar1 != '-') break;
    out_spec->left_justified = '-';
    out_spec->leading_zero_pad = '\0';
    cVar7 = '\0';
    pcVar4 = pcVar3;
  }
  out_spec->field_width = 0;
  out_spec->field_width_opt = '\0';
  cVar8 = *pcVar3;
  if (cVar8 == '*') {
    out_spec->field_width_opt = '\x02';
    pcVar3 = pcVar4 + 2;
  }
  else {
    iVar5 = 0;
    while ((byte)(cVar8 - 0x30U) < 10) {
      out_spec->field_width_opt = '\x01';
      iVar5 = iVar5 * 10 + (int)*pcVar3 + -0x30;
      out_spec->field_width = iVar5;
      pcVar4 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
      cVar8 = *pcVar4;
    }
  }
  out_spec->prec = 0;
  out_spec->prec_opt = '\0';
  bVar2 = true;
  if (*pcVar3 == '.') {
    if (pcVar3[1] == '-') {
      pcVar3 = pcVar3 + 2;
      bVar2 = true;
    }
    else {
      if (pcVar3[1] == '*') {
        out_spec->prec_opt = '\x02';
        pcVar3 = pcVar3 + 2;
        bVar2 = false;
        goto LAB_0010ad40;
      }
      pcVar3 = pcVar3 + 1;
      out_spec->prec_opt = '\x01';
      bVar2 = false;
    }
    iVar5 = 0;
    for (; (byte)(*pcVar3 - 0x30U) < 10; pcVar3 = pcVar3 + 1) {
      iVar5 = (uint)(byte)(*pcVar3 - 0x30U) + iVar5 * 10;
      out_spec->prec = iVar5;
    }
  }
LAB_0010ad40:
  out_spec->length_modifier = '\0';
  pcVar4 = pcVar3 + 1;
  cVar8 = *pcVar3;
  if (cVar8 == 'L') {
    out_spec->length_modifier = '\x02';
LAB_0010ada5:
    cVar8 = *pcVar4;
    pcVar6 = pcVar4;
  }
  else {
    if (cVar8 == 'l') {
      out_spec->length_modifier = '\x04';
      goto LAB_0010ada5;
    }
    pcVar6 = pcVar3;
    if (cVar8 == 'h') {
      out_spec->length_modifier = '\x01';
      cVar8 = *pcVar4;
      pcVar6 = pcVar4;
      if (cVar8 == 'h') {
        out_spec->length_modifier = '\x03';
        pcVar4 = pcVar3 + 2;
        goto LAB_0010ada5;
      }
    }
  }
  uVar9 = '\a';
  iVar5 = 0;
  switch(cVar8) {
  case 'X':
    out_spec->case_adjust = '\0';
    break;
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'q':
  case 'r':
  case 't':
  case 'v':
  case 'w':
    goto switchD_0010adce_caseD_59;
  case 'a':
    goto switchD_0010adce_caseD_61;
  case 'b':
switchD_0010adce_caseD_62:
    out_spec->conv_spec = '\x05';
    goto LAB_0010aead;
  case 'c':
    out_spec->conv_spec = '\x02';
    goto LAB_0010ae65;
  case 'd':
  case 'i':
    uVar9 = '\x04';
    break;
  case 'e':
switchD_0010adce_caseD_65:
    out_spec->conv_spec = '\f';
    goto LAB_0010aea2;
  case 'f':
switchD_0010adce_caseD_66:
    out_spec->conv_spec = '\v';
    goto LAB_0010aea2;
  case 'g':
switchD_0010adce_caseD_67:
    out_spec->conv_spec = '\r';
    goto LAB_0010aea2;
  case 'n':
    out_spec->conv_spec = '\n';
    goto LAB_0010ae65;
  case 'o':
    uVar9 = '\x06';
    break;
  case 'p':
    out_spec->conv_spec = '\t';
LAB_0010ae65:
    out_spec->prec_opt = '\0';
    goto LAB_0010aead;
  case 's':
    out_spec->conv_spec = '\x03';
    goto LAB_0010ae76;
  case 'u':
    uVar9 = '\b';
    break;
  case 'x':
    break;
  default:
    iVar5 = 0;
    switch(cVar8) {
    case 'A':
      out_spec->case_adjust = '\0';
      break;
    case 'B':
      out_spec->case_adjust = '\0';
      goto switchD_0010adce_caseD_62;
    case 'C':
    case 'D':
      goto switchD_0010adce_caseD_59;
    case 'E':
      out_spec->case_adjust = '\0';
      goto switchD_0010adce_caseD_65;
    case 'F':
      out_spec->case_adjust = '\0';
      goto switchD_0010adce_caseD_66;
    case 'G':
      out_spec->case_adjust = '\0';
      goto switchD_0010adce_caseD_67;
    default:
      if (cVar8 != '%') {
        return 0;
      }
      out_spec->conv_spec = '\x01';
      goto LAB_0010ae65;
    }
    goto switchD_0010adce_caseD_61;
  }
  out_spec->conv_spec = uVar9;
  if (!bVar2) {
LAB_0010ae76:
    out_spec->leading_zero_pad = '\0';
  }
LAB_0010aead:
  iVar5 = ((int)pcVar6 + 1) - (int)format;
switchD_0010adce_caseD_59:
  return iVar5;
LAB_0010acd1:
  pcVar4 = pcVar3;
  if (cVar8 == '\0') {
LAB_0010acf3:
    out_spec->prepend = cVar1;
    pcVar4 = pcVar3;
    cVar8 = cVar1;
  }
  goto LAB_0010acb3;
switchD_0010adce_caseD_61:
  out_spec->conv_spec = '\x0e';
LAB_0010aea2:
  if (bVar2) {
    out_spec->prec = 6;
  }
  goto LAB_0010aead;
}

Assistant:

static int npf_parse_format_spec(char const *format, npf_format_spec_t *out_spec) {
  char const *cur = format;

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->left_justified = 0;
  out_spec->leading_zero_pad = 0;
#endif
  out_spec->case_adjust = 'a' - 'A'; // lowercase
  out_spec->prepend = 0;
  out_spec->alt_form = 0;

  while (*++cur) { // cur points at the leading '%' character
    switch (*cur) { // Optional flags
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      case '-': out_spec->left_justified = '-'; out_spec->leading_zero_pad = 0; continue;
      case '0': out_spec->leading_zero_pad = !out_spec->left_justified; continue;
#endif
      case '+': out_spec->prepend = '+'; continue;
      case ' ': if (out_spec->prepend == 0) { out_spec->prepend = ' '; } continue;
      case '#': out_spec->alt_form = '#'; continue;
      default: break;
    }
    break;
  }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->field_width = 0;
  out_spec->field_width_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '*') {
    out_spec->field_width_opt = NPF_FMT_SPEC_OPT_STAR;
    ++cur;
  } else {
    while ((*cur >= '0') && (*cur <= '9')) {
      out_spec->field_width_opt = NPF_FMT_SPEC_OPT_LITERAL;
      out_spec->field_width = (out_spec->field_width * 10) + (*cur++ - '0');
    }
  }
#endif

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
  out_spec->prec = 0;
  out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '.') {
    ++cur;
    if (*cur == '*') {
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_STAR;
      ++cur;
    } else {
      if (*cur == '-') {
        ++cur;
      } else {
        out_spec->prec_opt = NPF_FMT_SPEC_OPT_LITERAL;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        out_spec->prec = (out_spec->prec * 10) + (*cur++ - '0');
      }
    }
  }
#endif

  uint_fast8_t tmp_conv = NPF_FMT_SPEC_CONV_NONE;
  out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_NONE;
  switch (*cur++) { // Length modifier
    case 'h':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_SHORT;
      if (*cur == 'h') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_CHAR;
        ++cur;
      }
      break;
    case 'l':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG;
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
      if (*cur == 'l') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_LONG_LONG;
        ++cur;
      }
#endif
      break;
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'L': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE; break;
#endif
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
    case 'j': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_INTMAX; break;
    case 'z': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_SIZET; break;
    case 't': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_PTRDIFFT; break;
#endif
    default: --cur; break;
  }

  switch (*cur++) { // Conversion specifier
    case '%': out_spec->conv_spec = NPF_FMT_SPEC_CONV_PERCENT;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 'c': out_spec->conv_spec = NPF_FMT_SPEC_CONV_CHAR;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 's': out_spec->conv_spec = NPF_FMT_SPEC_CONV_STRING;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      out_spec->leading_zero_pad = 0;
#endif
      break;

    case 'i':
    case 'd': tmp_conv = NPF_FMT_SPEC_CONV_SIGNED_INT;
    case 'o':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_OCTAL; }
    case 'u':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_UNSIGNED_INT; }
    case 'X':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { out_spec->case_adjust = 0; }
    case 'x':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_HEX_INT; }
      out_spec->conv_spec = (uint8_t)tmp_conv;
#if (NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1) && \
    (NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1)
      if (out_spec->prec_opt != NPF_FMT_SPEC_OPT_NONE) { out_spec->leading_zero_pad = 0; }
#endif
      break;

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'F': out_spec->case_adjust = 0;
    case 'f':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_DEC;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'E': out_spec->case_adjust = 0;
    case 'e':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SCI;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'G': out_spec->case_adjust = 0;
    case 'g':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SHORTEST;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'A': out_spec->case_adjust = 0;
    case 'a':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_HEX;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;
#endif

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
    case 'n':
      // todo: reject string if flags or width or precision exist
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_WRITEBACK;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;
#endif

    case 'p':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_POINTER;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
    case 'B':
      out_spec->case_adjust = 0;
    case 'b':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_BINARY;
      break;
#endif

    default: return 0;
  }

  return (int)(cur - format);
}